

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::prim::PurposeEnumHandler
            (expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *tok)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  undefined4 *puVar5;
  ostream *poVar6;
  long *plVar7;
  ulong *puVar8;
  pointer pbVar9;
  size_type sVar10;
  long lVar11;
  ulong uVar12;
  ulong *puVar13;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  ostringstream oss;
  string local_2f0;
  undefined1 local_2d0 [24];
  long lStack_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  ulong local_2a0;
  long lStack_298;
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  string *local_230;
  long *local_228 [2];
  long local_218 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  undefined2 *local_1c8;
  undefined8 local_1c0;
  undefined2 local_1b8;
  undefined6 uStack_1b6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  byte local_188;
  ios_base local_138 [264];
  
  puVar5 = (undefined4 *)operator_new(0x40);
  *puVar5 = 0;
  *(char **)(puVar5 + 2) = "default";
  puVar5[4] = 2;
  *(char **)(puVar5 + 6) = "proxy";
  puVar5[8] = 1;
  *(char **)(puVar5 + 10) = "render";
  puVar5[0xc] = 3;
  *(char **)(puVar5 + 0xe) = "guide";
  local_228[0] = local_218;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"purpose","");
  lVar11 = 8;
  do {
    iVar4 = ::std::__cxx11::string::compare((char *)tok);
    if (iVar4 == 0) {
      local_188 = 1;
      local_1a8._M_dataplus._M_p._0_1_ = 1;
      goto LAB_00201def;
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x48);
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_1a8.field_2;
  lVar11 = 0;
  local_230 = tok;
  do {
    ::std::__cxx11::string::string
              ((string *)&local_1a8,*(char **)((long)puVar5 + lVar11 + 8),(allocator *)&local_270);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
               &local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x40);
  local_288 = 2;
  local_280 = CONCAT53(local_280._3_5_,0x202c);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_2f0.field_2._M_allocated_capacity._0_2_ = 0x22;
  local_2f0._M_string_length = 1;
  local_290 = &local_280;
  quote((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_2d0,&local_1e8,&local_2f0);
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (local_2d0._0_8_ != local_2d0._8_8_) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,((_Alloc_hider *)local_2d0._0_8_)->_M_p,
               *(size_type *)(local_2d0._0_8_ + 8));
    local_2d0._0_8_ = local_2d0._0_8_ + 0x20;
    if (local_2d0._0_8_ != local_2d0._8_8_) {
      do {
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(char *)local_290,local_288);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(((pointer)local_2d0._0_8_)->_M_dataplus)._M_p,
                   ((pointer)local_2d0._0_8_)->_M_string_length);
        local_2d0._0_8_ = local_2d0._0_8_ + 0x20;
      } while (local_2d0._0_8_ != local_2d0._8_8_);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  ::std::ios_base::~ios_base(local_138);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  ::std::operator+(&local_208,"Allowed tokens are [",&local_270);
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_208);
  tok = local_230;
  local_2b0._M_allocated_capacity = (size_type)&local_2a0;
  puVar8 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar8) {
    local_2a0 = *puVar8;
    lStack_298 = plVar7[3];
  }
  else {
    local_2a0 = *puVar8;
    local_2b0._M_allocated_capacity = (size_type)(ulong *)*plVar7;
  }
  local_2b0._8_8_ = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_1b8 = 0x22;
  local_1c0 = 1;
  local_1a8.field_2._M_allocated_capacity._0_2_ = 0x22;
  local_1a8._M_string_length = 1;
  local_1c8 = &local_1b8;
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)(local_230->_M_dataplus)._M_p);
  plVar7 = (long *)::std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1c8);
  puVar8 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar8) {
    local_240 = *puVar8;
    lStack_238 = plVar7[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *puVar8;
    local_250 = (ulong *)*plVar7;
  }
  local_248 = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  uVar12 = 0xf;
  if ((ulong *)local_2b0._M_allocated_capacity != &local_2a0) {
    uVar12 = local_2a0;
  }
  if (uVar12 < (ulong)(local_248 + local_2b0._8_8_)) {
    uVar12 = 0xf;
    if (local_250 != &local_240) {
      uVar12 = local_240;
    }
    if (uVar12 < (ulong)(local_248 + local_2b0._8_8_)) goto LAB_00201bb4;
    plVar7 = (long *)::std::__cxx11::string::replace
                               ((ulong)&local_250,0,(char *)0x0,local_2b0._M_allocated_capacity);
  }
  else {
LAB_00201bb4:
    plVar7 = (long *)::std::__cxx11::string::_M_append(local_2b0._M_local_buf,(ulong)local_250);
  }
  local_2d0._0_8_ = local_2d0 + 0x10;
  pbVar9 = (pointer)(plVar7 + 2);
  if ((pointer)*plVar7 == pbVar9) {
    local_2d0._16_8_ = (pbVar9->_M_dataplus)._M_p;
    lStack_2b8 = plVar7[3];
  }
  else {
    local_2d0._16_8_ = (pbVar9->_M_dataplus)._M_p;
    local_2d0._0_8_ = (pointer)*plVar7;
  }
  local_2d0._8_8_ = plVar7[1];
  *plVar7 = (long)pbVar9;
  plVar7[1] = 0;
  *(undefined1 *)&(pbVar9->_M_dataplus)._M_p = 0;
  plVar7 = (long *)::std::__cxx11::string::append(local_2d0);
  local_1a8._M_dataplus._M_p = (pointer)*plVar7;
  puVar8 = (ulong *)(plVar7 + 2);
  if ((ulong *)local_1a8._M_dataplus._M_p == puVar8) {
    local_2f0.field_2._M_allocated_capacity = *puVar8;
    local_2f0.field_2._8_8_ = plVar7[3];
    local_1a8._M_string_length = plVar7[1];
    *plVar7 = (long)puVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
LAB_00201cc7:
    local_280 = local_2f0.field_2._M_allocated_capacity;
    lStack_278 = local_2f0.field_2._8_8_;
    local_2f0.field_2._M_allocated_capacity =
         local_2f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
LAB_00201cf2:
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    local_1a8.field_2._8_8_ = lStack_278;
  }
  else {
    local_280 = plVar7[2];
    local_1a8._M_string_length = plVar7[1];
    *plVar7 = (long)puVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_2f0.field_2._M_allocated_capacity = local_280;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == &local_2f0.field_2) goto LAB_00201cc7;
    local_2f0.field_2._M_allocated_capacity = local_280 & 0xffffffffffffff00;
    if ((ulong *)local_1a8._M_dataplus._M_p == &local_280) goto LAB_00201cf2;
  }
  local_1a8.field_2._M_allocated_capacity = local_280;
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_188 = 0;
  local_2f0._M_string_length = 0;
  local_288 = 0;
  local_280 = local_280 & 0xffffffffffffff00;
  local_290 = &local_280;
  if ((pointer)local_2d0._0_8_ != (pointer)(local_2d0 + 0x10)) {
    operator_delete((void *)local_2d0._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_2d0._16_8_)->_M_p + 1));
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT62(uStack_1b6,local_1b8) + 1);
  }
  if ((ulong *)local_2b0._M_allocated_capacity != &local_2a0) {
    operator_delete((void *)local_2b0._M_allocated_capacity,local_2a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT62(local_208.field_2._M_allocated_capacity._2_6_,
                             local_208.field_2._M_allocated_capacity._0_2_) + 1);
  }
  paVar2 = &local_270.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  if ((local_188 & 1) == 0) {
    local_270._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,local_1a8._M_dataplus._M_p,
               local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    puVar8 = (ulong *)((long)&(__return_storage_ptr__->contained).
                              super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0 + 0x10);
    *(ulong **)
     &(__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = puVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p == paVar2) {
      *puVar8 = local_270.field_2._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x18) = local_270.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_dataplus._M_p = local_270._M_dataplus._M_p;
      *(size_type *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x10) = local_270.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_string_length = local_270._M_string_length;
    goto LAB_0020216b;
  }
LAB_00201def:
  lVar11 = 0;
  do {
    iVar4 = ::std::__cxx11::string::compare((char *)tok);
    if (iVar4 == 0) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = *(value_type *)((long)puVar5 + lVar11);
      goto LAB_0020216b;
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x40);
  paVar2 = &local_208.field_2;
  local_208.field_2._M_allocated_capacity._0_2_ = 0x22;
  local_208._M_string_length = 1;
  paVar3 = &local_270.field_2;
  local_270._M_dataplus._M_p = (pointer)paVar3;
  local_208._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,paVar2,(undefined1 *)((long)&local_208.field_2 + 1));
  ::std::__cxx11::string::_M_append((char *)&local_270,(ulong)(tok->_M_dataplus)._M_p);
  plVar7 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)local_208._M_dataplus._M_p);
  puVar8 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar8) {
    local_2a0 = *puVar8;
    lStack_298 = plVar7[3];
    local_2b0._M_allocated_capacity = (size_type)&local_2a0;
  }
  else {
    local_2a0 = *puVar8;
    local_2b0._M_allocated_capacity = (size_type)(ulong *)*plVar7;
  }
  local_2b0._8_8_ = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar3) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  plVar7 = (long *)::std::__cxx11::string::append(local_2b0._M_local_buf);
  pbVar9 = (pointer)(plVar7 + 2);
  if ((pointer)*plVar7 == pbVar9) {
    local_2d0._16_8_ = (pbVar9->_M_dataplus)._M_p;
    lStack_2b8 = plVar7[3];
    local_2d0._0_8_ = (pointer)(local_2d0 + 0x10);
  }
  else {
    local_2d0._16_8_ = (pbVar9->_M_dataplus)._M_p;
    local_2d0._0_8_ = (pointer)*plVar7;
  }
  local_2d0._8_8_ = plVar7[1];
  *plVar7 = (long)pbVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)::std::__cxx11::string::_M_append(local_2d0,(ulong)local_228[0]);
  puVar8 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_2f0.field_2._M_allocated_capacity = *puVar8;
    local_2f0.field_2._8_8_ = plVar7[3];
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = *puVar8;
    local_2f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2f0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_2f0);
  local_290 = &local_280;
  puVar8 = (ulong *)*plVar7;
  puVar13 = (ulong *)(plVar7 + 2);
  if (puVar8 == puVar13) {
    local_280 = *puVar13;
    lStack_278 = plVar7[3];
    sVar10 = plVar7[1];
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
LAB_00202096:
    local_270.field_2._M_allocated_capacity = local_280;
    local_270.field_2._8_8_ = lStack_278;
    local_280 = local_280 & 0xffffffffffffff00;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->contained).
                          super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0 + 0x10);
LAB_002020be:
    *(size_type *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x10) = local_270.field_2._M_allocated_capacity;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x18) = local_270.field_2._8_8_;
  }
  else {
    local_270.field_2._M_allocated_capacity = plVar7[2];
    sVar10 = plVar7[1];
    *plVar7 = (long)puVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_280 = local_270.field_2._M_allocated_capacity;
    if (puVar8 == local_290) goto LAB_00202096;
    local_280 = local_270.field_2._M_allocated_capacity & 0xffffffffffffff00;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->contained).
                          super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8 == paVar3) goto LAB_002020be;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_dataplus._M_p = (pointer)puVar8;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x10) = local_270.field_2._M_allocated_capacity;
  }
  local_288 = 0;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_error._M_string_length = sVar10;
  local_270._M_string_length = 0;
  local_270.field_2._M_allocated_capacity =
       local_270.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_270._M_dataplus._M_p = (pointer)paVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_2d0._0_8_ != (pointer)(local_2d0 + 0x10)) {
    operator_delete((void *)local_2d0._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_2d0._16_8_)->_M_p + 1));
  }
  if ((ulong *)local_2b0._M_allocated_capacity != &local_2a0) {
    operator_delete((void *)local_2b0._M_allocated_capacity,local_2a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT62(local_208.field_2._M_allocated_capacity._2_6_,
                             local_208.field_2._M_allocated_capacity._0_2_) + 1);
  }
LAB_0020216b:
  if ((local_188 == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2)) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  operator_delete(puVar5,0x40);
  return __return_storage_ptr__;
}

Assistant:

static nonstd::expected<Purpose, std::string> PurposeEnumHandler(const std::string &tok) {
  using EnumTy = std::pair<Purpose, const char *>;
  const std::vector<EnumTy> enums = {
      std::make_pair(Purpose::Default, "default"),
      std::make_pair(Purpose::Proxy, "proxy"),
      std::make_pair(Purpose::Render, "render"),
      std::make_pair(Purpose::Guide, "guide"),
  };
  return EnumHandler<Purpose>("purpose", tok, enums);
}